

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::reporters::Reporter_testInMemoryReporter_Test::~Reporter_testInMemoryReporter_Test
          (Reporter_testInMemoryReporter_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Reporter, testInMemoryReporter)
{
    InMemoryReporter reporter;
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
    }
    ASSERT_EQ(kNumReports, reporter.spansSubmitted());
    reporter.reset();
    ASSERT_EQ(0, reporter.spansSubmitted());
    reporter.close();
}